

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void Am_Register_Support(Am_Value_Type type,Am_Type_Support *support)

{
  _Rb_tree_header *p_Var1;
  Am_Type_Support *pAVar2;
  mapped_type *ppAVar3;
  key_type_conflict local_1c;
  Am_Value_Type local_1a;
  
  if (Support_Table == (Am_Map_Support *)0x0) {
    Support_Table = (Am_Map_Support *)operator_new(0x38);
    p_Var1 = &(Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
    ;
    (Support_Table->mMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pAVar2 = type_type_support;
    local_1c = 0x4014;
    ppAVar3 = std::
              map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
              ::operator[]((map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
                            *)Support_Table,&local_1c);
    *ppAVar3 = pAVar2;
  }
  local_1a = type;
  ppAVar3 = std::
            map<unsigned_short,_Am_Type_Support_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Type_Support_*>_>_>
            ::operator[](&Support_Table->mMap,&local_1a);
  *ppAVar3 = support;
  return;
}

Assistant:

void
Am_Register_Support(Am_Value_Type type, Am_Type_Support *support)
{
  verify_support_table();
  Support_Table->SetAt(type, support);
}